

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O2

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_token<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end)

{
  char cVar1;
  char *pcVar2;
  compiler_token_type cVar3;
  char **ppcVar4;
  
  ppcVar4 = eat_ws_<char_const*>(this,begin,end);
  if (*ppcVar4 == end) {
    cVar3 = token_end_of_pattern;
  }
  else {
    pcVar2 = *begin;
    cVar1 = *pcVar2;
    cVar3 = token_invalid_quantifier;
    switch(cVar1) {
    case '$':
      *begin = pcVar2 + 1;
      cVar3 = token_assert_end_line;
      break;
    case '(':
      *begin = pcVar2 + 1;
      cVar3 = token_group_begin;
      break;
    case ')':
      *begin = pcVar2 + 1;
      cVar3 = token_group_end;
      break;
    case '*':
    case '+':
      break;
    case '.':
      *begin = pcVar2 + 1;
      cVar3 = token_any;
      break;
    default:
      if (cVar1 == '?') {
        return token_invalid_quantifier;
      }
      if (cVar1 == '[') {
        *begin = pcVar2 + 1;
        return token_charset_begin;
      }
      if (cVar1 == '|') {
        *begin = pcVar2 + 1;
        return token_alternate;
      }
      if (cVar1 == '^') {
        *begin = pcVar2 + 1;
        return token_assert_begin_line;
      }
      if (cVar1 == '\\') {
        *begin = pcVar2 + 1;
        cVar3 = get_escape_token<char_const*>(this,begin,end);
        return cVar3;
      }
    case '%':
    case '&':
    case '\'':
    case ',':
    case '-':
      cVar3 = token_literal;
    }
  }
  return cVar3;
}

Assistant:

regex_constants::compiler_token_type get_token(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        if(this->eat_ws_(begin, end) == end)
        {
            return regex_constants::token_end_of_pattern;
        }

        switch(*begin)
        {
        case BOOST_XPR_CHAR_(char_type, '\\'): return this->get_escape_token(++begin, end);
        case BOOST_XPR_CHAR_(char_type, '.'): ++begin; return token_any;
        case BOOST_XPR_CHAR_(char_type, '^'): ++begin; return token_assert_begin_line;
        case BOOST_XPR_CHAR_(char_type, '$'): ++begin; return token_assert_end_line;
        case BOOST_XPR_CHAR_(char_type, '('): ++begin; return token_group_begin;
        case BOOST_XPR_CHAR_(char_type, ')'): ++begin; return token_group_end;
        case BOOST_XPR_CHAR_(char_type, '|'): ++begin; return token_alternate;
        case BOOST_XPR_CHAR_(char_type, '['): ++begin; return token_charset_begin;

        case BOOST_XPR_CHAR_(char_type, '*'):
        case BOOST_XPR_CHAR_(char_type, '+'):
        case BOOST_XPR_CHAR_(char_type, '?'):
            return token_invalid_quantifier;

        case BOOST_XPR_CHAR_(char_type, ']'):
        case BOOST_XPR_CHAR_(char_type, '{'):
        default:
            return token_literal;
        }
    }